

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O3

REF_STATUS
ref_interp_best_tri_in_list
          (REF_INTERP ref_interp,REF_LIST ref_list,REF_DBL *xyz,REF_INT *cell,REF_DBL *bary)

{
  REF_INT cell_00;
  int iVar1;
  REF_CELL pRVar2;
  REF_INT *pRVar3;
  REF_DBL *pRVar4;
  uint uVar5;
  undefined8 uVar6;
  long lVar7;
  char *pcVar8;
  REF_STATUS ref_private_macro_code_rxs;
  long lVar9;
  double dVar10;
  REF_INT tet1;
  REF_INT tet0;
  REF_DBL current_bary3 [3];
  REF_INT tri_nodes [27];
  REF_INT tet_nodes [27];
  int local_170;
  uint local_16c;
  int local_168;
  int local_164;
  double local_160;
  REF_NODE local_158;
  REF_DBL *local_150;
  double local_148 [3];
  REF_CELL local_130;
  REF_INT *local_128;
  REF_DBL *local_120;
  REF_INT local_118 [28];
  REF_INT local_a8 [30];
  
  local_150 = xyz;
  if (0 < ref_list->n) {
    pRVar2 = ref_interp->from_tri;
    local_130 = ref_interp->from_tet;
    local_158 = ref_interp->from_grid->node;
    local_160 = -999.0;
    local_170 = -1;
    lVar9 = 0;
    local_128 = cell;
    local_120 = bary;
    do {
      cell_00 = ref_list->value[lVar9];
      uVar5 = ref_cell_nodes(pRVar2,cell_00,local_118);
      if (uVar5 != 0) {
        pcVar8 = "cell";
        uVar6 = 0x1d0;
        goto LAB_001731cf;
      }
      uVar5 = ref_node_bary3d(local_158,local_118,local_150,local_148);
      if ((uVar5 & 0xfffffffb) != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x1d2,"ref_interp_best_tri_in_list",(ulong)uVar5,"bary");
        local_16c = uVar5;
      }
      pRVar4 = local_120;
      pRVar3 = local_128;
      if (uVar5 != 4) {
        if (uVar5 != 0) {
          return local_16c;
        }
        dVar10 = local_148[0];
        if (local_148[1] <= local_148[0]) {
          dVar10 = local_148[1];
        }
        if (local_148[2] <= dVar10) {
          dVar10 = local_148[2];
        }
        if ((local_170 == -1) || (local_160 < dVar10)) {
          local_170 = cell_00;
          local_160 = dVar10;
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < ref_list->n);
    if (local_170 != -1) {
      uVar5 = ref_cell_nodes(pRVar2,local_170,local_118);
      if (uVar5 != 0) {
        pcVar8 = "cell";
        uVar6 = 0x1df;
LAB_001731cf:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               uVar6,"ref_interp_best_tri_in_list",(ulong)uVar5,pcVar8);
        return uVar5;
      }
      uVar5 = ref_node_bary3d(local_158,local_118,local_150,local_148);
      pRVar2 = local_130;
      if (uVar5 != 0) {
        pcVar8 = "bary3d";
        uVar6 = 0x1e0;
        goto LAB_001731cf;
      }
      local_118[3] = local_118[0];
      uVar5 = ref_cell_with_face(local_130,local_118,&local_164,&local_168);
      if (uVar5 != 0) {
        pcVar8 = "find with face";
        uVar6 = 0x1e2;
        goto LAB_001731cf;
      }
      if (local_164 != -1) {
        if ((long)local_168 != -1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x1e4,"ref_interp_best_tri_in_list","found two tets for boundary face",
                 0xffffffffffffffff,(long)local_168);
          return 1;
        }
        *pRVar3 = local_164;
        uVar5 = ref_cell_nodes(pRVar2,local_164,local_a8);
        if (uVar5 == 0) {
          lVar9 = 0;
          do {
            pRVar4[lVar9] = 0.0;
            iVar1 = local_a8[lVar9];
            lVar7 = 0;
            do {
              if (local_118[lVar7] == iVar1) {
                pRVar4[lVar9] = local_148[lVar7];
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 != 3);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 4);
          return 0;
        }
        pcVar8 = "cell";
        uVar6 = 0x1e7;
        goto LAB_001731cf;
      }
      pcVar8 = "no tet for tri";
      uVar6 = 0x1e3;
      goto LAB_0017319c;
    }
  }
  pcVar8 = "failed to find tri";
  uVar6 = 0x1dd;
LAB_0017319c:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar6,
         "ref_interp_best_tri_in_list",pcVar8);
  return 1;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_best_tri_in_list(REF_INTERP ref_interp,
                                                      REF_LIST ref_list,
                                                      REF_DBL *xyz,
                                                      REF_INT *cell,
                                                      REF_DBL *bary) {
  REF_CELL ref_tri = ref_interp_from_tri(ref_interp);
  REF_CELL ref_tet = ref_interp_from_tet(ref_interp);
  REF_NODE ref_node = ref_grid_node(ref_interp_from_grid(ref_interp));
  REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT tet_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, tri_candidate, best_candidate, tet0, tet1, i, j;
  REF_DBL current_bary3[3];
  REF_DBL best_bary, min_bary;
  REF_STATUS status;

  best_candidate = REF_EMPTY;
  best_bary = -999.0;
  each_ref_list_item(ref_list, item) {
    tri_candidate = ref_list_value(ref_list, item);
    RSS(ref_cell_nodes(ref_tri, tri_candidate, tri_nodes), "cell");
    status = ref_node_bary3d(ref_node, tri_nodes, xyz, current_bary3);
    RXS(status, REF_DIV_ZERO, "bary");
    if (REF_SUCCESS == status) { /* exclude REF_DIV_ZERO */

      min_bary = MIN(MIN(current_bary3[0], current_bary3[1]), current_bary3[2]);
      if (REF_EMPTY == best_candidate || min_bary > best_bary) {
        best_candidate = tri_candidate;
        best_bary = min_bary;
      }
    }
  }

  RUS(REF_EMPTY, best_candidate, "failed to find tri");

  RSS(ref_cell_nodes(ref_tri, best_candidate, tri_nodes), "cell");
  RSS(ref_node_bary3d(ref_node, tri_nodes, xyz, current_bary3), "bary3d");
  tri_nodes[3] = tri_nodes[0];
  RSS(ref_cell_with_face(ref_tet, tri_nodes, &tet0, &tet1), "find with face");
  RUS(REF_EMPTY, tet0, "no tet for tri");
  REIS(REF_EMPTY, tet1, "found two tets for boundary face");

  *cell = tet0;
  RSS(ref_cell_nodes(ref_tet, tet0, tet_nodes), "cell");
  for (i = 0; i < 4; i++) {
    bary[i] = 0.0;
    for (j = 0; j < 3; j++) {
      if (tri_nodes[j] == tet_nodes[i]) bary[i] = current_bary3[j];
    }
  }

  return REF_SUCCESS;
}